

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int iter_codes(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_CFunction local_30;
  char *s;
  int lax;
  lua_State *L_local;
  
  iVar1 = lua_toboolean(L,2);
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  if (((int)*pcVar2 & 0xc0U) == 0x80) {
    luaL_argerror(L,1,"invalid UTF-8 code");
  }
  if (iVar1 == 0) {
    local_30 = iter_auxstrict;
  }
  else {
    local_30 = iter_auxlax;
  }
  lua_pushcclosure(L,local_30,0);
  lua_pushvalue(L,1);
  lua_pushinteger(L,0);
  return 3;
}

Assistant:

static int iter_codes (lua_State *L) {
  int lax = lua_toboolean(L, 2);
  const char *s = luaL_checkstring(L, 1);
  luaL_argcheck(L, !iscontp(s), 1, MSGInvalid);
  lua_pushcfunction(L, lax ? iter_auxlax : iter_auxstrict);
  lua_pushvalue(L, 1);
  lua_pushinteger(L, 0);
  return 3;
}